

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::checkAndResizeMeshViewDim
          (TParseContext *this,TSourceLoc *loc,TType *type,bool isBlockMember)

{
  TVector<glslang::TArraySize> *pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  char *pcVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint size;
  
  iVar2 = (*type->_vptr_TType[10])(type);
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0xd) & 4) == 0) {
    return;
  }
  if (isBlockMember) {
    iVar2 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar2 == '\0') {
      if (!isBlockMember) goto LAB_004b5d2d;
      goto LAB_004b5dc1;
    }
  }
  else {
LAB_004b5d2d:
    if (((type->arraySizes == (TArraySizes *)0x0) ||
        (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0))
       || ((int)((ulong)((long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar1->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2)) {
LAB_004b5dc1:
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar5 = "requires a view array dimension";
      pcVar4 = "perviewNV";
      goto LAB_004b5df3;
    }
  }
  size = 4;
  if ((this->super_TParseContextBase).parsingBuiltins == false) {
    size = (this->resources).maxMeshViewCountNV;
  }
  iVar2 = (*type->_vptr_TType[0x14])(type);
  uVar3 = TSmallArrayVector::getDimSize
                    ((TSmallArrayVector *)CONCAT44(extraout_var_00,iVar2),(uint)!isBlockMember);
  if (uVar3 == size || uVar3 == 0) {
    if (uVar3 != 0) {
      return;
    }
    iVar2 = (*type->_vptr_TType[0x14])(type);
    TSmallArrayVector::setDimSize
              ((TSmallArrayVector *)CONCAT44(extraout_var_01,iVar2),(uint)!isBlockMember,size);
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar5 = "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized";
  pcVar4 = "[]";
LAB_004b5df3:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,pcVar4,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::checkAndResizeMeshViewDim(const TSourceLoc& loc, TType& type, bool isBlockMember)
{
    // see if member is a per-view attribute
    if (!type.getQualifier().isPerView())
        return;

    if ((isBlockMember && type.isArray()) || (!isBlockMember && type.isArrayOfArrays())) {
        // since we don't have the maxMeshViewCountNV set during parsing builtins, we hardcode the value.
        int maxViewCount = parsingBuiltins ? 4 : resources.maxMeshViewCountNV;
        // For block members, outermost array dimension is the view dimension.
        // For non-block members, outermost array dimension is the vertex/primitive dimension
        // and 2nd outermost is the view dimension.
        int viewDim = isBlockMember ? 0 : 1;
        int viewDimSize = type.getArraySizes()->getDimSize(viewDim);

        if (viewDimSize != UnsizedArraySize && viewDimSize != maxViewCount)
            error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
        else if (viewDimSize == UnsizedArraySize)
            type.getArraySizes()->setDimSize(viewDim, maxViewCount);
    }
    else {
        error(loc, "requires a view array dimension", "perviewNV", "");
    }
}